

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

opensshcert_key * opensshcert_new_shared(ssh_keyalg *self,ptrlen blob,strbuf **basepub_out)

{
  blob_fmt *pbVar1;
  _Bool _Var2;
  opensshcert_key *poVar3;
  strbuf *psVar4;
  uint64_t uVar5;
  unsigned_long uVar6;
  strbuf *psVar7;
  ptrlen pVar8;
  BlobTransformer bt [1];
  BinarySource src [1];
  
  src[0].len = blob.len;
  src[0].data = blob.ptr;
  pbVar1 = (blob_fmt *)self->extra;
  src[0].binarysource_ = src;
  src[0].pos = 0;
  src[0].err = BSE_NO_ERROR;
  pVar8 = BinarySource_get_string(src[0].binarysource_);
  _Var2 = ptrlen_eq_string(pVar8,(char *)pbVar1[3].fmt);
  if (_Var2) {
    poVar3 = (opensshcert_key *)safemalloc(1,0x70,0);
    poVar3->nonce = (strbuf *)0x0;
    poVar3->serial = 0;
    *(undefined8 *)&poVar3->type = 0;
    poVar3->key_id = (strbuf *)0x0;
    poVar3->valid_principals = (strbuf *)0x0;
    poVar3->valid_after = 0;
    poVar3->valid_before = 0;
    poVar3->critical_options = (strbuf *)0x0;
    poVar3->extensions = (strbuf *)0x0;
    poVar3->reserved = (strbuf *)0x0;
    poVar3->basekey = (ssh_key *)0x0;
    poVar3->signature_key = (strbuf *)0x0;
    poVar3->signature = (strbuf *)0x0;
    (poVar3->sshk).vt = self;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar4 = strbuf_dup(pVar8);
    poVar3->nonce = psVar4;
    psVar4 = strbuf_new();
    BinarySink_put_stringz(psVar4->binarysink_,(char *)pbVar1[3].len);
    bt[0].parts = (ptrlen *)0x0;
    bt[0].nparts = 0;
    blobtrans_read(bt,src,*pbVar1);
    blobtrans_write(bt,psVar4->binarysink_,*pbVar1);
    blobtrans_clear(bt);
    uVar5 = BinarySource_get_uint64(src[0].binarysource_);
    poVar3->serial = uVar5;
    uVar6 = BinarySource_get_uint32(src[0].binarysource_);
    poVar3->type = (uint32_t)uVar6;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->key_id = psVar7;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->valid_principals = psVar7;
    uVar5 = BinarySource_get_uint64(src[0].binarysource_);
    poVar3->valid_after = uVar5;
    uVar5 = BinarySource_get_uint64(src[0].binarysource_);
    poVar3->valid_before = uVar5;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->critical_options = psVar7;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->extensions = psVar7;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->reserved = psVar7;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->signature_key = psVar7;
    pVar8 = BinarySource_get_string(src[0].binarysource_);
    psVar7 = strbuf_dup(pVar8);
    poVar3->signature = psVar7;
    if ((src[0].binarysource_)->err == BSE_NO_ERROR) {
      *basepub_out = psVar4;
      return poVar3;
    }
    (*((poVar3->sshk).vt)->freekey)(&poVar3->sshk);
    strbuf_free(psVar4);
  }
  return (opensshcert_key *)0x0;
}

Assistant:

static opensshcert_key *opensshcert_new_shared(
    const ssh_keyalg *self, ptrlen blob, strbuf **basepub_out)
{
    const opensshcert_extra *extra = self->extra;

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, blob);

    /* Check the initial key-type string */
    if (!ptrlen_eq_string(get_string(src), extra->cert_key_ssh_id))
        return NULL;

    opensshcert_key *ck = snew(opensshcert_key);
    memset(ck, 0, sizeof(*ck));
    ck->sshk.vt = self;

    ck->nonce = strbuf_dup(get_string(src));
    strbuf *basepub = strbuf_new();
    {
        put_stringz(basepub, extra->base_key_ssh_id);

        /* Make the base public key blob out of the public key
         * material in the certificate. This invocation of the
         * blobtrans system doesn't do any format translation, but it
         * does ensure that the right amount of data is copied so that
         * src ends up in the right position to read the remaining
         * certificate fields. */
        BLOBTRANS_DECLARE(bt);
        blobtrans_read(bt, src, extra->pub_fmt);
        blobtrans_write(bt, BinarySink_UPCAST(basepub), extra->pub_fmt);
        blobtrans_clear(bt);
    }
    ck->serial = get_uint64(src);
    ck->type = get_uint32(src);
    ck->key_id = strbuf_dup(get_string(src));
    ck->valid_principals = strbuf_dup(get_string(src));
    ck->valid_after = get_uint64(src);
    ck->valid_before = get_uint64(src);
    ck->critical_options = strbuf_dup(get_string(src));
    ck->extensions = strbuf_dup(get_string(src));
    ck->reserved = strbuf_dup(get_string(src));
    ck->signature_key = strbuf_dup(get_string(src));
    ck->signature = strbuf_dup(get_string(src));


    if (get_err(src)) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        return NULL;
    }

    *basepub_out = basepub;
    return ck;
}